

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O1

Instr * __thiscall
Lowerer::LowerIsInst(Lowerer *this,Instr *isInstInstr,JnHelperMethod helperMethod)

{
  LowererMD *this_00;
  IntConstOpnd *this_01;
  Instr *pIVar1;
  code *pcVar2;
  OpndKind OVar3;
  bool bVar4;
  uint32 inlineCacheIndex;
  undefined4 *puVar5;
  Opnd *pOVar6;
  Instr *pIVar7;
  Opnd *pOVar8;
  
  this_01 = (IntConstOpnd *)isInstInstr->m_src1;
  OVar3 = IR::Opnd::GetKind((Opnd *)this_01);
  if (OVar3 != OpndKindIntConst) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0xc0,"(this->IsIntConstOpnd())","Bad call to AsIntConstOpnd()");
    if (!bVar4) goto LAB_005b254a;
    *puVar5 = 0;
  }
  this_00 = &this->m_lowererMD;
  inlineCacheIndex = IR::IntConstOpnd::AsUint32(this_01);
  pOVar6 = LoadIsInstInlineCacheOpnd(this,isInstInstr,inlineCacheIndex);
  pIVar7 = LowererMD::LoadHelperArgument(this_00,isInstInstr,pOVar6);
  IR::Instr::FreeSrc1(isInstInstr);
  pOVar6 = IR::Instr::UnlinkSrc2(isInstInstr);
  OVar3 = IR::Opnd::GetKind(pOVar6);
  if (OVar3 != OpndKindReg) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
    if (!bVar4) goto LAB_005b254a;
    *puVar5 = 0;
  }
  if (((ulong)pOVar6[1]._vptr_Opnd[3] & 1) == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x19bc,"(argOpnd->m_sym->m_isSingleDef)","argOpnd->m_sym->m_isSingleDef");
    if (!bVar4) goto LAB_005b254a;
    *puVar5 = 0;
  }
  pIVar1 = (Instr *)pOVar6[1]._vptr_Opnd[5];
  IR::Opnd::Free(pOVar6,this->m_func);
  LoadScriptContext(this,isInstInstr);
  pOVar6 = IR::Instr::UnlinkSrc1(pIVar1);
  pOVar8 = IR::Instr::UnlinkSrc2(pIVar1);
  OVar3 = IR::Opnd::GetKind(pOVar8);
  if (OVar3 != OpndKindReg) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
    if (!bVar4) goto LAB_005b254a;
    *puVar5 = 0;
  }
  if (((ulong)pOVar8[1]._vptr_Opnd[3] & 1) == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x19c6,"(argOpnd->m_sym->m_isSingleDef)","argOpnd->m_sym->m_isSingleDef");
    if (!bVar4) goto LAB_005b254a;
    *puVar5 = 0;
  }
  IR::Instr::Remove(pIVar1);
  pIVar1 = (Instr *)pOVar8[1]._vptr_Opnd[5];
  IR::Opnd::Free(pOVar8,this->m_func);
  pOVar8 = IR::Instr::UnlinkSrc1(pIVar1);
  LowererMD::LoadHelperArgument(this_00,isInstInstr,pOVar8);
  if (pIVar1->m_src2 != (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x19ce,"(instrArg->GetSrc2() == __null)","instrArg->GetSrc2() == NULL");
    if (!bVar4) {
LAB_005b254a:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  IR::Instr::Remove(pIVar1);
  LowererMD::LoadHelperArgument(this_00,isInstInstr,pOVar6);
  LowererMD::ChangeToHelperCall
            (this_00,isInstInstr,helperMethod,(LabelInstr *)0x0,(Opnd *)0x0,(PropertySymOpnd *)0x0,
             false);
  return pIVar7;
}

Assistant:

IR::Instr *
Lowerer::LowerIsInst(IR::Instr * isInstInstr, IR::JnHelperMethod helperMethod)
{
    IR::Instr * instrPrev;
    IR::Instr * instrArg;
    IR::RegOpnd * argOpnd;

    // inlineCache
    instrPrev = m_lowererMD.LoadHelperArgument(isInstInstr, LoadIsInstInlineCacheOpnd(isInstInstr, isInstInstr->GetSrc1()->AsIntConstOpnd()->AsUint32()));
    isInstInstr->FreeSrc1();

    argOpnd = isInstInstr->UnlinkSrc2()->AsRegOpnd();
    Assert(argOpnd->m_sym->m_isSingleDef);
    instrArg = argOpnd->m_sym->m_instrDef;
    argOpnd->Free(m_func);

    // scriptContext
    LoadScriptContext(isInstInstr);

    // instance goes last, so remember it now
    IR::Opnd * instanceOpnd = instrArg->UnlinkSrc1();
    argOpnd = instrArg->UnlinkSrc2()->AsRegOpnd();
    Assert(argOpnd->m_sym->m_isSingleDef);
    instrArg->Remove();
    instrArg = argOpnd->m_sym->m_instrDef;
    argOpnd->Free(m_func);

    // function
    IR::Opnd *opnd = instrArg->UnlinkSrc1();
    m_lowererMD.LoadHelperArgument(isInstInstr, opnd);
    Assert(instrArg->GetSrc2() == NULL);
    instrArg->Remove();

    // instance
    m_lowererMD.LoadHelperArgument(isInstInstr, instanceOpnd);

    m_lowererMD.ChangeToHelperCall(isInstInstr, helperMethod);

    return instrPrev;
}